

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf.c
# Opt level: O1

void com_alf_init_map(com_seqh_t *seqhdr,u8 *alf_idx_map)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  
  iVar1 = seqhdr->max_cuwh;
  uVar2 = seqhdr->pic_width_in_lcu;
  iVar6 = uVar2 + 4;
  if (-1 < (int)(uVar2 + 1)) {
    iVar6 = uVar2 + 1;
  }
  iVar3 = seqhdr->pic_height_in_lcu;
  iVar7 = iVar3 + 4;
  if (-1 < iVar3 + 1) {
    iVar7 = iVar3 + 1;
  }
  seqhdr->alf_idx_map = alf_idx_map;
  if (0 < iVar3) {
    iVar8 = (iVar6 >> 2) * iVar1;
    iVar6 = (iVar7 >> 2) * iVar1;
    iVar7 = 0;
    do {
      iVar9 = 0xc;
      if ((iVar6 != 0) && (iVar5 = (iVar7 * iVar1) / iVar6, iVar9 = iVar5 * 4, 3 < iVar5)) {
        iVar9 = 0xc;
      }
      if (0 < (int)uVar2) {
        iVar5 = 0;
        uVar10 = 0;
        do {
          if ((iVar8 == 0) || (iVar4 = iVar5 / iVar8, 2 < iVar4)) {
            iVar4 = 3;
          }
          alf_idx_map[uVar10] = (&DAT_0015ea80)[(long)(iVar4 + iVar9) * 4];
          uVar10 = uVar10 + 1;
          iVar5 = iVar5 + iVar1;
        } while (uVar2 != uVar10);
      }
      alf_idx_map = alf_idx_map + (int)uVar2;
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar3);
  }
  return;
}

Assistant:

void com_alf_init_map(com_seqh_t *seqhdr, u8 *alf_idx_map)
{
    const int tab_region[NO_VAR_BINS] = { 0, 1, 4, 5, 15, 2, 3, 6, 14, 11, 10, 7, 13, 12,  9,  8 };
    int lcu_size = seqhdr->max_cuwh;
    int img_width_in_lcu  = seqhdr->pic_width_in_lcu;
    int img_height_in_lcu = seqhdr->pic_height_in_lcu;
    int regin_w = ((img_width_in_lcu  + 1) / 4 * lcu_size);
    int regin_h = ((img_height_in_lcu + 1) / 4 * lcu_size);

    seqhdr->alf_idx_map = alf_idx_map;

    for (int i = 0; i < img_height_in_lcu; i++) {
        int offset_y = (regin_h ? COM_MIN(3, (i * lcu_size) / regin_h) : 3) << 2;

        for (int j = 0; j < img_width_in_lcu; j++) {
            int offset_x = (regin_w ? COM_MIN(3, (j * lcu_size) / regin_w) : 3);
            alf_idx_map[j] = tab_region[offset_y + offset_x];
        }
        alf_idx_map += img_width_in_lcu;
    }
}